

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::want_tick(torrent *this)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if ((this->super_torrent_hot_members).m_connections.
        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        .
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->super_torrent_hot_members).m_connections.
        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        .
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    bVar2 = is_finished(this);
    if (((!bVar2) &&
        ((this->m_web_seeds).
         super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->m_web_seeds))
       && ((this->field_0x5c0 & 8) != 0)) {
      return true;
    }
    iVar3 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x1c +
            *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc
    ;
    puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x4c;
    iVar4 = iVar3 + *(int *)puVar1;
    if (iVar4 != 0 && SCARRY4(iVar3,*(int *)puVar1) == iVar4 < 0) {
      return true;
    }
    iVar3 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x3c +
            *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x2c;
    puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x5c;
    iVar4 = iVar3 + *(int *)puVar1;
    if (iVar4 != 0 && SCARRY4(iVar3,*(int *)puVar1) == iVar4 < 0) {
      return true;
    }
    if ((((this->super_torrent_hot_members).field_0x4b & 8) == 0) &&
       ((this->field_0x600 & 0x40) == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool torrent::want_tick() const
	{
		if (m_abort) return false;

		if (!m_connections.empty()) return true;

		// we might want to connect web seeds
		if (!is_finished() && !m_web_seeds.empty() && m_files_checked)
			return true;

		if (m_stat.low_pass_upload_rate() > 0 || m_stat.low_pass_download_rate() > 0)
			return true;

		// if we don't get ticks we won't become inactive
		if (!m_paused && !m_inactive) return true;

		return false;
	}